

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O2

MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_> *
__thiscall
deqp::egl::Image::CreateImageGLES2::getImageSource
          (MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           *__return_storage_ptr__,CreateImageGLES2 *this,EGLint target,GLenum internalFormat,
          GLenum format,GLenum type,bool useTexLevel0)

{
  if (5 < target - 0x30b3U) {
    if (target == 0x3140) {
      createAndroidNativeImageSource(__return_storage_ptr__,internalFormat);
      return __return_storage_ptr__;
    }
    if (target == 0x30b9) {
      createRenderbufferImageSource(__return_storage_ptr__,internalFormat);
      return __return_storage_ptr__;
    }
    if (target != 0x30b1) {
      (__return_storage_ptr__->
      super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
      ).m_data.ptr = (ImageSource *)0x0;
      return __return_storage_ptr__;
    }
  }
  createTextureImageSource(__return_storage_ptr__,target,internalFormat,format,type,useTexLevel0);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ImageSource> getImageSource (EGLint target, GLenum internalFormat, GLenum format, GLenum type, bool useTexLevel0)
	{
		switch (target)
		{
			case EGL_GL_TEXTURE_2D_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_X_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Y_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Y_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Z_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Z_KHR:
				DE_ASSERT(format != 0u && type != 0u);
				return createTextureImageSource(target, internalFormat, format, type, useTexLevel0);

			case EGL_GL_RENDERBUFFER_KHR:
				DE_ASSERT(format == 0u && type == 0u);
				return createRenderbufferImageSource(internalFormat);

			case EGL_NATIVE_BUFFER_ANDROID:
				DE_ASSERT(format == 0u && type == 0u);
				return createAndroidNativeImageSource(internalFormat);

			default:
				DE_FATAL("Impossible");
				return MovePtr<ImageSource>();
		}
	}